

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

SurfaceInteraction * __thiscall
pbrt::Cylinder::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Cylinder *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  Transform *pTVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  Tuple3<pbrt::Vector3,_float> local_1e0;
  Normal3f local_1d0;
  Vector3f local_1c4;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  Tuple2<pbrt::Point2,_float> local_180;
  Tuple3<pbrt::Vector3,_float> local_178;
  Tuple3<pbrt::Vector3,_float> local_168;
  Point3f pHit;
  Normal3f local_14c;
  Point3fi local_140;
  SurfaceInteraction local_128;
  
  pHit.super_Tuple3<pbrt::Point3,_float>.z = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  pHit.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  pHit.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  fVar1 = this->phiMax;
  local_1e0.z = this->zMax - this->zMin;
  local_1e0.x = 0.0;
  local_1e0.y = 0.0;
  local_1c4.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_1b8 = ZEXT416((uint)local_1e0.z);
  local_198 = vinsertps_avx(ZEXT416((uint)isect->phi),
                            ZEXT416((uint)(pHit.super_Tuple3<pbrt::Point3,_float>.z - this->zMin)),
                            0x10);
  auVar12._0_12_ = ZEXT812(0);
  auVar12._12_4_ = 0;
  local_1a8 = ZEXT416((uint)fVar1);
  auVar14 = ZEXT416((uint)local_1e0.z);
  auVar8 = vfmadd213ss_fma(local_1b8,auVar14,auVar12);
  fVar16 = fVar1 * -fVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = pHit.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6 = vmovshdup_avx(auVar11);
  local_1c4.super_Tuple3<pbrt::Vector3,_float>.y =
       fVar1 * (float)pHit.super_Tuple3<pbrt::Point3,_float>.x;
  local_1c4.super_Tuple3<pbrt::Vector3,_float>.x = auVar6._0_4_ * -fVar1;
  auVar15._0_12_ = ZEXT812(0);
  auVar15._12_4_ = 0;
  fVar7 = local_1c4.super_Tuple3<pbrt::Vector3,_float>.y * 0.0;
  auVar13 = ZEXT416((uint)local_1c4.super_Tuple3<pbrt::Vector3,_float>.x);
  auVar15 = vfmadd213ss_fma(auVar15,auVar13,ZEXT416((uint)fVar7));
  fVar1 = local_1e0.z * local_1c4.super_Tuple3<pbrt::Vector3,_float>.y + 0.0;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(local_1c4.super_Tuple3<pbrt::Vector3,_float>.y *
                                         local_1c4.super_Tuple3<pbrt::Vector3,_float>.y)),auVar13,
                           auVar13);
  auVar10 = vfnmadd231ss_fma(ZEXT416((uint)(local_1e0.z *
                                           local_1c4.super_Tuple3<pbrt::Vector3,_float>.x)),auVar13,
                             auVar14);
  auVar13 = vfmadd231ss_fma(auVar15,auVar14,auVar12);
  fVar5 = (0.0 - local_1e0.z * local_1c4.super_Tuple3<pbrt::Vector3,_float>.x) + auVar10._0_4_;
  auVar20._0_12_ = ZEXT812(0);
  auVar20._12_4_ = 0;
  auVar15 = vfmsub213ss_fma(auVar20,ZEXT416((uint)local_1c4.super_Tuple3<pbrt::Vector3,_float>.x),
                            ZEXT416((uint)fVar7));
  auVar10 = vfnmadd231ss_fma(ZEXT416((uint)fVar7),
                             ZEXT416((uint)local_1c4.super_Tuple3<pbrt::Vector3,_float>.y),auVar12);
  fVar7 = auVar15._0_4_ + auVar10._0_4_;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar5)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar1)
                           );
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
  auVar15 = vsqrtss_avx(auVar15,auVar15);
  auVar10._8_4_ = 0x7fffffff;
  auVar10._0_8_ = 0x7fffffff7fffffff;
  auVar10._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar11,auVar10);
  auVar14._8_4_ = 0x34400002;
  auVar14._0_8_ = 0x3440000234400002;
  auVar14._12_4_ = 0x34400002;
  auVar11 = vmulps_avx512vl(auVar10,auVar14);
  fVar19 = auVar15._0_4_;
  auVar18._0_4_ = fVar1 / fVar19;
  auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar17._0_4_ = fVar7 / fVar19;
  auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * fVar16 * (fVar5 / fVar19))),auVar18,
                           ZEXT416((uint)(fVar16 * (float)pHit.super_Tuple3<pbrt::Point3,_float>.x))
                          );
  auVar14 = vfmsub231ss_fma(ZEXT416((uint)(auVar13._0_4_ * auVar13._0_4_)),auVar9,auVar8);
  auVar15 = vfmadd231ss_fma(auVar6,auVar17,ZEXT416((uint)(fVar16 * 0.0)));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)((fVar5 / fVar19) * 0.0)),auVar12,auVar18);
  auVar10 = vfmadd231ss_fma(auVar6,auVar12,auVar17);
  fVar16 = 1.0 / auVar14._0_4_;
  auVar14 = ZEXT416((uint)(auVar9._0_4_ * -auVar10._0_4_));
  auVar6 = vfmadd213ss_fma(auVar15,auVar13,auVar14);
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(auVar15._0_4_ * auVar8._0_4_)),auVar10,auVar13);
  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar10._0_4_)),auVar10,auVar13);
  auVar15 = vfmadd213ss_fma(auVar10,auVar13,auVar14);
  fVar1 = fVar16 * auVar9._0_4_;
  fVar5 = fVar16 * auVar6._0_4_;
  fVar7 = fVar16 * auVar8._0_4_;
  fVar16 = fVar16 * auVar15._0_4_;
  local_1d0.super_Tuple3<pbrt::Normal3,_float>.y = fVar5 * 0.0;
  local_14c.super_Tuple3<pbrt::Normal3,_float>.y = fVar16 * 0.0;
  local_1d0.super_Tuple3<pbrt::Normal3,_float>.x =
       fVar1 * local_1c4.super_Tuple3<pbrt::Vector3,_float>.x +
       local_1d0.super_Tuple3<pbrt::Normal3,_float>.y;
  local_1d0.super_Tuple3<pbrt::Normal3,_float>.z = fVar1 * 0.0 + local_1e0.z * fVar5;
  local_1d0.super_Tuple3<pbrt::Normal3,_float>.y =
       fVar1 * local_1c4.super_Tuple3<pbrt::Vector3,_float>.y +
       local_1d0.super_Tuple3<pbrt::Normal3,_float>.y;
  local_14c.super_Tuple3<pbrt::Normal3,_float>.x =
       local_1c4.super_Tuple3<pbrt::Vector3,_float>.x * fVar7 +
       local_14c.super_Tuple3<pbrt::Normal3,_float>.y;
  local_14c.super_Tuple3<pbrt::Normal3,_float>.z = fVar7 * 0.0 + local_1e0.z * fVar16;
  local_14c.super_Tuple3<pbrt::Normal3,_float>.y =
       local_1c4.super_Tuple3<pbrt::Vector3,_float>.y * fVar7 +
       local_14c.super_Tuple3<pbrt::Normal3,_float>.y;
  local_168._0_8_ = vmovlps_avx(auVar11);
  local_168.z = 0.0;
  pTVar4 = this->objectFromRender;
  fVar1 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar5 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar7 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  bVar2 = this->reverseOrientation;
  bVar3 = this->transformSwapsHandedness;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (pTVar4->m).m[0][1])),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(pTVar4->m).m[0][0]));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (pTVar4->m).m[1][1])),ZEXT416((uint)fVar5),
                            ZEXT416((uint)(pTVar4->m).m[1][0]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (pTVar4->m).m[2][1])),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(pTVar4->m).m[2][0]));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar7),ZEXT416((uint)(pTVar4->m).m[0][2]));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar7),ZEXT416((uint)(pTVar4->m).m[1][2]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar7),ZEXT416((uint)(pTVar4->m).m[2][2]));
  auVar6 = vinsertps_avx(auVar6,auVar15,0x10);
  local_178._0_8_ = vmovlps_avx(auVar6);
  local_178.z = auVar8._0_4_;
  pTVar4 = this->renderFromObject;
  Point3fi::Point3fi(&local_140,&pHit,(Vector3f *)&local_168);
  auVar6 = vinsertps_avx(local_1a8,ZEXT416((uint)local_1b8._0_4_),0x10);
  auVar6 = vdivps_avx(local_198,auVar6);
  local_180 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar6);
  SurfaceInteraction::SurfaceInteraction
            (&local_128,&local_140,(Point2f *)&local_180,(Vector3f *)&local_178,&local_1c4,
             (Vector3f *)&local_1e0,&local_1d0,&local_14c,time,bVar2 != bVar3);
  Transform::operator()(__return_storage_ptr__,pTVar4,&local_128);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of cylinder hit
        Float u = phi / phiMax;
        Float v = (pHit.z - zMin) / (zMax - zMin);
        // Compute cylinder $\dpdu$ and $\dpdv$
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv(0, 0, zMax - zMin);

        // Compute cylinder $\dndu$ and $\dndv$
        Vector3f d2Pduu = -phiMax * phiMax * Vector3f(pHit.x, pHit.y, 0);
        Vector3f d2Pduv(0, 0, 0), d2Pdvv(0, 0, 0);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float invEGF2 = 1 / (E * G - F * F);
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Compute error bounds for cylinder intersection
        Vector3f pError = gamma(3) * Abs(Vector3f(pHit.x, pHit.y, 0));

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }